

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2f::BuildLogTestTruncate::~BuildLogTestTruncate(BuildLogTestTruncate *this)

{
  pointer ppNVar1;
  pointer ppEVar2;
  
  (this->super_BuildLogTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__StateTestWithBuiltinRules_001cf088;
  ppNVar1 = (this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.defaults_.
            super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (ppNVar1 != (pointer)0x0) {
    operator_delete(ppNVar1,(long)*(pointer *)
                                   ((long)&(this->super_BuildLogTest).
                                           super_StateTestWithBuiltinRules.state_.defaults_.
                                           super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                           _M_impl.super__Vector_impl_data + 0x10) - (long)ppNVar1);
  }
  (this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.bindings_.super_Env._vptr_Env =
       (_func_int **)&PTR__BindingEnv_001d6ce0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.bindings_.rules_.
               _M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.bindings_.bindings_
               ._M_t);
  ppEVar2 = (this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.edges_.
            super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)*(pointer *)
                                   ((long)&(this->super_BuildLogTest).
                                           super_StateTestWithBuiltinRules.state_.edges_.
                                           super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                                           _M_impl.super__Vector_impl_data + 0x10) - (long)ppEVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Pool_*>_>_>
  ::~_Rb_tree(&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_.pools_._M_t);
  std::
  _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&(this->super_BuildLogTest).super_StateTestWithBuiltinRules.state_);
  operator_delete(this,0x120);
  return;
}

Assistant:

TEST_F(BuildLogTest, Truncate) {
  AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n");

  {
    BuildLog log1;
    string err;
    EXPECT_TRUE(log1.OpenForWrite(kTestFilename, *this, &err));
    ASSERT_EQ("", err);
    log1.RecordCommand(state_.edges_[0], 15, 18);
    log1.RecordCommand(state_.edges_[1], 20, 25);
    log1.Close();
  }

  struct stat statbuf;
  ASSERT_EQ(0, stat(kTestFilename, &statbuf));
  ASSERT_GT(statbuf.st_size, 0);

  // For all possible truncations of the input file, assert that we don't
  // crash when parsing.
  for (off_t size = statbuf.st_size; size > 0; --size) {
    BuildLog log2;
    string err;
    EXPECT_TRUE(log2.OpenForWrite(kTestFilename, *this, &err));
    ASSERT_EQ("", err);
    log2.RecordCommand(state_.edges_[0], 15, 18);
    log2.RecordCommand(state_.edges_[1], 20, 25);
    log2.Close();

    ASSERT_TRUE(Truncate(kTestFilename, size, &err));

    BuildLog log3;
    err.clear();
    ASSERT_TRUE(log3.Load(kTestFilename, &err) == LOAD_SUCCESS || !err.empty());
  }
}